

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O3

void __thiscall
bdNode::msgin_connect_genmsg
          (bdNode *this,bdId *id,bdToken *transId,int msgtype,bdId *srcAddr,bdId *destAddr,int mode,
          int param,int status)

{
  undefined8 uVar1;
  
  switch(msgtype) {
  case 0x65:
    bdAccount::incCounter(&this->mAccount,9,false);
    bdConnectManager::recvedConnectionRequest(this->mConnMgr,id,srcAddr,destAddr,mode,param);
    break;
  case 0x66:
    bdAccount::incCounter(&this->mAccount,10,false);
    bdConnectManager::recvedConnectionReply(this->mConnMgr,id,srcAddr,destAddr,mode,param,status);
    break;
  case 0x67:
    bdAccount::incCounter(&this->mAccount,0xb,false);
    bdConnectManager::recvedConnectionStart(this->mConnMgr,id,srcAddr,destAddr,mode,param);
    break;
  case 0x68:
    bdAccount::incCounter(&this->mAccount,0xc,false);
    bdConnectManager::recvedConnectionAck(this->mConnMgr,id,srcAddr,destAddr,mode);
    break;
  default:
    uVar1 = 0;
    goto LAB_00117791;
  }
  uVar1 = 0x10;
LAB_00117791:
  (*(this->super_bdNodePublisher)._vptr_bdNodePublisher[4])(this,id,uVar1);
  return;
}

Assistant:

void bdNode::msgin_connect_genmsg(bdId *id, bdToken *transId, int msgtype, 
					bdId *srcAddr, bdId *destAddr, int mode, int param, int status) {
	std::list<bdId>::iterator it;

#ifdef DEBUG_NODE_MSGS
	std::cerr << "bdConnectManager::msgin_connect_genmsg() Type: " << getConnectMsgType(msgtype);
	std::cerr << " TransId: ";
	bdPrintTransId(std::cerr, transId);
	std::cerr << " From: ";
	mFns->bdPrintId(std::cerr, id);
	std::cerr << " SrcAddr: ";
	mFns->bdPrintId(std::cerr, srcAddr);
	std::cerr << " DestAddr: ";
	mFns->bdPrintId(std::cerr, destAddr);
	std::cerr << " Mode: " << mode;
	std::cerr << " Param: " << param;
	std::cerr << " Status: " << status;
	std::cerr << std::endl;
#else
	(void) transId;
#endif

	/* switch to actual work functions */
	uint32_t peerflags = 0;
	switch(msgtype) {
		case BITDHT_MSG_TYPE_CONNECT_REQUEST:
			peerflags = BITDHT_PEER_STATUS_RECV_CONNECT_MSG; 
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTREQUEST, false);


			mConnMgr->recvedConnectionRequest(id, srcAddr, destAddr, mode, param);

			break;
		case BITDHT_MSG_TYPE_CONNECT_REPLY:
			peerflags = BITDHT_PEER_STATUS_RECV_CONNECT_MSG; 
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTREPLY, false);

			mConnMgr->recvedConnectionReply(id, srcAddr, destAddr, mode, param, status);

			break;
		case BITDHT_MSG_TYPE_CONNECT_START:
			peerflags = BITDHT_PEER_STATUS_RECV_CONNECT_MSG; 
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTSTART, false);

			mConnMgr->recvedConnectionStart(id, srcAddr, destAddr, mode, param);

			break;
		case BITDHT_MSG_TYPE_CONNECT_ACK:
			peerflags = BITDHT_PEER_STATUS_RECV_CONNECT_MSG; 
			mAccount.incCounter(BDACCOUNT_MSG_CONNECTACK, false);

			mConnMgr->recvedConnectionAck(id, srcAddr, destAddr, mode);

			break;
		default:
			break;
	}

	/* received message - so peer must be good */
	addPeer(id, peerflags);

}